

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t *psVar1;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  int iVar4;
  SectionTracker *pSVar5;
  IMutableContext *pIVar6;
  TestCaseStats local_358;
  undefined1 local_1c8 [8];
  TestCaseInfo testInfo;
  Totals prevTotals;
  string redirectedCout;
  string redirectedCerr;
  
  testInfo._264_8_ = (this->m_totals).assertions.passed;
  prevTotals.assertions.passed = (this->m_totals).assertions.failed;
  prevTotals.assertions.failed = (this->m_totals).assertions.failedButOk;
  prevTotals.assertions.failedButOk = (this->m_totals).testCases.passed;
  prevTotals.testCases.passed = (this->m_totals).testCases.failed;
  prevTotals.testCases.failed = (this->m_totals).testCases.failedButOk;
  prevTotals.testCases.failedButOk = (size_t)&redirectedCout._M_string_length;
  redirectedCout._M_dataplus._M_p = (pointer)0x0;
  redirectedCout._M_string_length._0_1_ = 0;
  redirectedCout.field_2._8_8_ = &redirectedCerr._M_string_length;
  redirectedCerr._M_dataplus._M_p = (pointer)0x0;
  redirectedCerr._M_string_length._0_1_ = 0;
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_1c8,&testCase->super_TestCaseInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar2,local_1c8);
  redirectedCerr.field_2._8_8_ = &this->m_totals;
  this->m_activeTestCase = testCase;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      pSVar5 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(string *)local_1c8);
      this->m_testCaseTracker = (ITracker *)pSVar5;
      runCurrentTest(this,(string *)&prevTotals.testCases.failedButOk,
                     (string *)((long)&redirectedCout.field_2 + 8));
      iVar4 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar4 != '\0') break;
      iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
    } while ((char)iVar4 == '\0');
    pIVar6 = getCurrentMutableContext();
    iVar4 = (*(pIVar6->super_IContext)._vptr_IContext[5])(pIVar6);
    if ((char)iVar4 == '\0') break;
    iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  } while ((char)iVar4 == '\0');
  Totals::delta(__return_storage_ptr__,(Totals *)redirectedCerr.field_2._8_8_,
                (Totals *)&testInfo.properties);
  sVar3 = (__return_storage_ptr__->testCases).passed;
  if ((sVar3 != 0 & (byte)testInfo.lineInfo.line >> 2) == 1) {
    psVar1 = &(__return_storage_ptr__->assertions).failed;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->testCases).passed = sVar3 - 1;
    psVar1 = &(__return_storage_ptr__->testCases).failed;
    *psVar1 = *psVar1 + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar2 = (this->m_reporter).m_p;
  iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestCaseStats::TestCaseStats
            (&local_358,(TestCaseInfo *)local_1c8,__return_storage_ptr__,
             (string *)&prevTotals.testCases.failedButOk,
             (string *)((long)&redirectedCout.field_2 + 8),SUB41(iVar4,0));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_358);
  TestCaseStats::~TestCaseStats(&local_358);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_1c8);
  std::__cxx11::string::~string((string *)(redirectedCout.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&prevTotals.testCases.failedButOk);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }